

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O1

void __thiscall cmProcess::OnAllocate(cmProcess *this,size_t param_1,uv_buf_t *buf)

{
  char *base;
  uv_buf_t uVar1;
  
  if ((long)(this->Buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->Buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != 0x10000) {
    std::vector<char,_std::allocator<char>_>::resize(&this->Buf,0x10000);
  }
  base = (this->Buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
         ._M_start;
  uVar1 = uv_buf_init(base,*(int *)&(this->Buf).super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (int)base);
  *buf = uVar1;
  return;
}

Assistant:

void cmProcess::OnAllocate(size_t /*suggested_size*/, uv_buf_t* buf)
{
  if (this->Buf.size() != CM_PROCESS_BUF_SIZE) {
    this->Buf.resize(CM_PROCESS_BUF_SIZE);
  }

  *buf =
    uv_buf_init(this->Buf.data(), static_cast<unsigned int>(this->Buf.size()));
}